

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  pointer pcVar4;
  cmGeneratorTarget *this_01;
  cmValue cVar5;
  ulong uVar6;
  long lVar7;
  string_view arg;
  string local_50;
  
  this_00 = this->LG->Makefile;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CROSSCOMPILING","");
  bVar2 = cmMakefile::IsOn(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     (pcVar4 = (this->CommandLines).
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                         super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) >> 3) *
     -0x55555555 != 0)) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                          (this->LG,*(string **)
                                     ((long)&(pcVar4->
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + lVar7));
      if (this_01 != (cmGeneratorTarget *)0x0) {
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == EXECUTABLE) {
          bVar2 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar2) {
            local_50._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"CROSSCOMPILING_EMULATOR","");
            cVar5 = cmGeneratorTarget::GetProperty(this_01,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (cVar5.Value != (string *)0x0) {
              arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
              arg._M_len = (cVar5.Value)->_M_string_length;
              cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&(((this->EmulatorsWithArguments).
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data + lVar7),false);
            }
          }
        }
      }
      uVar6 = uVar6 + 1;
      pcVar4 = (this->CommandLines).
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x18;
    } while (uVar6 < (uint)((int)((ulong)((long)(this->CommandLines).
                                                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                .
                                                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pcVar4) >> 3) * -0x55555555));
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      cmExpandList(*emulator_property, this->EmulatorsWithArguments[c]);
    }
  }
}